

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  float fVar2;
  char cVar3;
  ushort uVar4;
  ImDrawVert *__src;
  unsigned_short *__src_00;
  ImDrawVert *pIVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  long lVar12;
  ImFontGlyph *pIVar13;
  ImDrawVert *__dest;
  unsigned_short *__dest_00;
  uint uVar14;
  char *text_end_00;
  ImDrawIdx IVar15;
  char *pcVar16;
  char *in_text;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  uint c;
  uint local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImDrawIdx *local_a8;
  ImDrawVert *local_a0;
  int local_94;
  int local_90;
  ImU32 local_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_78;
  undefined1 local_68 [16];
  ulong local_58;
  char *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar18 = pos.x;
  fVar21 = pos.y;
  local_8c = col;
  local_78 = wrap_width;
  if (text_end == (char *)0x0) {
    fStack_80 = in_XMM1_Dc;
    local_88 = pos;
    fStack_7c = in_XMM1_Dd;
    sVar9 = strlen(text_begin);
    text_end = text_begin + sVar9;
    fVar18 = (float)local_88._0_4_;
    fVar21 = (float)local_88._4_4_;
    in_XMM1_Dc = fStack_80;
    in_XMM1_Dd = fStack_7c;
  }
  fVar23 = (float)(int)fVar21;
  fVar24 = (float)(int)fVar21;
  fVar25 = (float)(int)fVar21;
  local_b8 = (float)(int)fVar21 + (this->DisplayOffset).y;
  fVar35 = clip_rect->w;
  if (local_b8 <= fVar35) {
    fStack_44 = (float)(int)fVar21;
    fStack_40 = (float)(int)in_XMM1_Dc;
    fStack_3c = (float)(int)in_XMM1_Dd;
    local_48 = (float)(int)fVar18 + (this->DisplayOffset).x;
    fVar18 = size / this->FontSize;
    fVar21 = this->FontSize * fVar18;
    local_88._0_4_ = fVar21;
    fVar21 = local_b8 + fVar21;
    local_68 = ZEXT416((uint)clip_rect->y);
    fStack_b4 = fVar23;
    fStack_b0 = fVar24;
    fStack_ac = fVar25;
    if (text_begin < text_end && (fVar21 < clip_rect->y && local_78 <= 0.0)) {
      do {
        local_b8 = fVar21;
        fStack_b4 = fVar23;
        fStack_b0 = fVar24;
        fStack_ac = fVar25;
        pvVar10 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          text_begin = text_end;
        }
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar21 = (float)local_88._0_4_ + local_b8;
      } while ((fVar21 < (float)local_68._0_4_) && (text_begin < text_end));
    }
    text_end_00 = text_end;
    if ((local_78 <= 0.0) &&
       (pcVar11 = text_begin, fVar21 = local_b8, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar11, fVar21 < fVar35 && (pcVar11 < text_end))) {
        local_68._0_4_ = fVar21;
        pvVar10 = memchr(pcVar11,10,(long)text_end - (long)pcVar11);
        pcVar11 = (char *)((long)pvVar10 + 1);
        if (pvVar10 == (void *)0x0) {
          pcVar11 = text_end;
        }
        fVar21 = (float)local_68._0_4_ + (float)local_88._0_4_;
      }
    }
    if (text_begin != text_end_00) {
      iVar7 = (int)text_end_00 - (int)text_begin;
      local_94 = iVar7 * 6;
      local_90 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_94,iVar7 * 4);
      local_a0 = draw_list->_VtxWritePtr;
      local_a8 = draw_list->_IdxWritePtr;
      local_58 = (ulong)draw_list->_VtxCurrentIdx;
      local_50 = (char *)0x0;
      fVar21 = local_48;
      fVar35 = local_78;
      fVar23 = local_48;
      fVar24 = local_b8;
      fVar25 = fStack_b4;
      fVar19 = fStack_b0;
      fVar20 = fStack_ac;
      pcVar11 = local_50;
      fVar33 = local_48;
      pcVar16 = text_begin;
joined_r0x00137abf:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar16;
        fVar34 = fVar33;
        fVar30 = local_b8;
        fVar2 = fStack_b4;
        fVar31 = fStack_b0;
        fVar22 = fStack_ac;
        pcVar6 = local_50;
        if (0.0 < fVar35) {
          if (pcVar11 == (char *)0x0) {
            local_68._0_4_ = fVar24;
            pcVar11 = CalcWordWrapPositionA
                                (this,fVar18,text_begin,text_end_00,(fVar23 - fVar21) + fVar35);
            fVar25 = 0.0;
            fVar19 = 0.0;
            fVar20 = 0.0;
            pcVar11 = pcVar11 + (pcVar11 == text_begin);
            fVar24 = (float)local_68._0_4_;
            fVar35 = local_78;
            fVar23 = local_48;
          }
          in_text = text_begin;
          fVar34 = fVar21;
          fVar30 = fVar24;
          fVar2 = fVar25;
          fVar31 = fVar19;
          fVar22 = fVar20;
          pcVar6 = pcVar11;
          if (pcVar11 <= text_begin) {
            pcVar11 = text_begin;
            if (text_begin < text_end_00) {
              lVar12 = (long)text_end_00 - (long)text_begin;
              do {
                cVar3 = *text_begin;
                if ((cVar3 != ' ') && (cVar3 != '\t')) {
                  pcVar11 = text_begin;
                  if (cVar3 == '\n') {
                    pcVar11 = text_begin + 1;
                  }
                  break;
                }
                text_begin = text_begin + 1;
                lVar12 = lVar12 + -1;
                pcVar11 = text_end_00;
              } while (lVar12 != 0);
            }
            text_begin = pcVar11;
            fVar21 = fVar23;
            fVar24 = fVar24 + (float)local_88._0_4_;
            pcVar11 = (char *)0x0;
            goto joined_r0x00137abf;
          }
        }
        local_50 = pcVar6;
        fStack_ac = fVar22;
        fStack_b0 = fVar31;
        fStack_b4 = fVar2;
        local_b8 = fVar30;
        local_bc = (uint)*in_text;
        if (*in_text < '\0') {
          iVar7 = ImTextCharFromUtf8(&local_bc,in_text,text_end_00);
          if (local_bc == 0) break;
          text_begin = in_text + iVar7;
          fVar35 = local_78;
          fVar23 = local_48;
        }
        else {
          text_begin = in_text + 1;
        }
        fVar24 = local_b8;
        fVar25 = fStack_b4;
        fVar19 = fStack_b0;
        fVar20 = fStack_ac;
        pcVar11 = local_50;
        pcVar16 = text_begin;
        if (0x1f < local_bc) {
LAB_00137c36:
          if (((int)(local_bc & 0xffff) < (this->IndexLookup).Size) &&
             (uVar4 = (this->IndexLookup).Data[local_bc & 0xffff], uVar4 != 0xffff)) {
            pIVar13 = (ImFontGlyph *)
                      ((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar4 * 0x28));
          }
          else {
            pIVar13 = this->FallbackGlyph;
          }
          if (pIVar13 == (ImFontGlyph *)0x0) {
            fVar21 = 0.0;
          }
          else {
            fVar21 = pIVar13->AdvanceX * fVar18;
            if ((local_bc != 9) && (local_bc != 0x20)) {
              fVar30 = pIVar13->X0 * fVar18 + fVar34;
              fVar33 = clip_rect->z;
              if (fVar30 <= fVar33) {
                fVar31 = pIVar13->X1 * fVar18 + fVar34;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar31) {
                  fVar32 = pIVar13->Y0 * fVar18 + local_b8;
                  fVar27 = pIVar13->Y1 * fVar18 + local_b8;
                  fVar22 = pIVar13->U0;
                  fVar29 = pIVar13->V0;
                  fVar28 = pIVar13->U1;
                  fVar26 = pIVar13->V1;
                  if (cpu_fine_clip) {
                    if (fVar30 < fVar2) {
                      fVar22 = fVar22 + (fVar28 - fVar22) *
                                        (1.0 - (fVar31 - fVar2) / (fVar31 - fVar30));
                      fVar30 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar32 < fVar2) {
                      fVar29 = fVar29 + (fVar26 - fVar29) *
                                        (1.0 - (fVar27 - fVar2) / (fVar27 - fVar32));
                      fVar32 = fVar2;
                    }
                    if (fVar33 < fVar31) {
                      fVar28 = (fVar28 - fVar22) * ((fVar33 - fVar30) / (fVar31 - fVar30)) + fVar22;
                      fVar31 = fVar33;
                    }
                    fVar33 = clip_rect->w;
                    if (fVar33 < fVar27) {
                      fVar26 = (fVar26 - fVar29) * ((fVar33 - fVar32) / (fVar27 - fVar32)) + fVar29;
                      fVar27 = fVar33;
                    }
                    if (fVar27 <= fVar32) goto LAB_00137d56;
                  }
                  IVar15 = (ImDrawIdx)local_58;
                  *local_a8 = IVar15;
                  local_a8[1] = IVar15 + 1;
                  local_a8[2] = IVar15 + 2;
                  local_a8[3] = IVar15;
                  local_a8[4] = IVar15 + 2;
                  local_a8[5] = IVar15 + 3;
                  (local_a0->pos).x = fVar30;
                  (local_a0->pos).y = fVar32;
                  local_a0->col = local_8c;
                  (local_a0->uv).x = fVar22;
                  (local_a0->uv).y = fVar29;
                  local_a0[1].pos.x = fVar31;
                  local_a0[1].pos.y = fVar32;
                  local_a0[1].col = local_8c;
                  local_a0[1].uv.x = fVar28;
                  local_a0[1].uv.y = fVar29;
                  local_a0[2].pos.x = fVar31;
                  local_a0[2].pos.y = fVar27;
                  local_a0[2].col = local_8c;
                  local_a0[2].uv.x = fVar28;
                  local_a0[2].uv.y = fVar26;
                  local_a0[3].pos.x = fVar30;
                  local_a0[3].pos.y = fVar27;
                  local_a0[3].col = local_8c;
                  local_a0[3].uv.x = fVar22;
                  local_a0[3].uv.y = fVar26;
                  local_a0 = local_a0 + 4;
                  local_58 = (ulong)((int)local_58 + 4);
                  local_a8 = local_a8 + 6;
                }
              }
            }
          }
LAB_00137d56:
          fVar21 = fVar34 + fVar21;
          fVar33 = fVar21;
          goto joined_r0x00137abf;
        }
        if (local_bc != 10) {
          fVar21 = fVar34;
          fVar33 = fVar34;
          if (local_bc != 0xd) goto LAB_00137c36;
          goto joined_r0x00137abf;
        }
        local_b8 = local_b8 + (float)local_88._0_4_;
        fVar21 = fVar23;
        fVar24 = local_b8;
        fVar33 = fVar23;
      } while (local_b8 < clip_rect->w || local_b8 == clip_rect->w);
      pIVar5 = local_a0;
      iVar8 = (int)((ulong)((long)local_a0 - (long)(draw_list->VtxBuffer).Data) >> 2);
      uVar14 = iVar8 * -0x33333333;
      iVar7 = (draw_list->VtxBuffer).Capacity;
      if (SBORROW4(iVar7,uVar14) != iVar7 + iVar8 * 0x33333333 < 0) {
        if (iVar7 == 0) {
          uVar17 = 8;
        }
        else {
          uVar17 = iVar7 / 2 + iVar7;
        }
        if ((int)uVar17 <= (int)uVar14) {
          uVar17 = uVar14;
        }
        __dest = (ImDrawVert *)ImGui::MemAlloc((long)(int)uVar17 * 0x14);
        __src = (draw_list->VtxBuffer).Data;
        if (__src != (ImDrawVert *)0x0) {
          memcpy(__dest,__src,(long)(draw_list->VtxBuffer).Size * 0x14);
          ImGui::MemFree((draw_list->VtxBuffer).Data);
        }
        (draw_list->VtxBuffer).Data = __dest;
        (draw_list->VtxBuffer).Capacity = uVar17;
      }
      (draw_list->VtxBuffer).Size = uVar14;
      iVar7 = (draw_list->IdxBuffer).Capacity;
      iVar8 = (int)((ulong)((long)local_a8 - (long)(draw_list->IdxBuffer).Data) >> 1);
      if (iVar7 < iVar8) {
        if (iVar7 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar7 / 2 + iVar7;
        }
        if (iVar7 <= iVar8) {
          iVar7 = iVar8;
        }
        __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar7 * 2);
        __src_00 = (draw_list->IdxBuffer).Data;
        if (__src_00 != (unsigned_short *)0x0) {
          memcpy(__dest_00,__src_00,(long)(draw_list->IdxBuffer).Size * 2);
          ImGui::MemFree((draw_list->IdxBuffer).Data);
        }
        (draw_list->IdxBuffer).Data = __dest_00;
        (draw_list->IdxBuffer).Capacity = iVar7;
        uVar14 = (draw_list->VtxBuffer).Size;
      }
      (draw_list->IdxBuffer).Size = iVar8;
      pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
      pIVar1->ElemCount = pIVar1->ElemCount + (iVar8 - (local_90 + local_94));
      draw_list->_VtxWritePtr = pIVar5;
      draw_list->_IdxWritePtr = local_a8;
      draw_list->_VtxCurrentIdx = uVar14;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((ImWchar)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}